

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assign.h
# Opt level: O2

void Eigen::internal::
     assign_impl<Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_-1,_0,_2,_2>_>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_-1,_0,_2,_2>_>,_3,_0,_0>
     ::run(SelfCwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,__1,_0,_2,_2>_>_>
           *dst,CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,__1,_0,_2,_2>_>
                *src)

{
  double *pdVar1;
  double dVar2;
  PointerType pdVar3;
  long lVar4;
  ulong end;
  double dVar5;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,__1,_0,_2,_2>_>
  *_other;
  Index index;
  ulong end_00;
  
  pdVar3 = (dst->m_matrix->
           super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_Eigen::Dense>).
           super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_0>.m_data;
  lVar4 = (dst->m_matrix->
          super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_0>.m_cols.
          m_value;
  end = lVar4 * 2;
  end_00 = (ulong)((uint)((ulong)pdVar3 >> 3) & 1);
  if (SBORROW8(end_00,end) == (long)(end_00 + lVar4 * -2) < 0) {
    end_00 = end;
  }
  if (((ulong)pdVar3 & 7) != 0) {
    end_00 = end;
  }
  lVar4 = end_00 + ((long)(end - end_00) / 2) * 2;
  unaligned_assign_impl<false>::
  run<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,_1,0,2,2>>,Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,_1,true>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,_1,0,2,2>>>>
            (src,dst,0,end_00);
  for (; (long)end_00 < lVar4; end_00 = end_00 + 2) {
    pdVar3 = (dst->m_matrix->
             super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_Eigen::Dense>).
             super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_0>.
             m_data;
    dVar2 = (src->m_functor).m_other;
    pdVar1 = pdVar3 + end_00;
    dVar5 = pdVar1[1];
    pdVar3 = pdVar3 + end_00;
    *pdVar3 = dVar2 * *pdVar1;
    pdVar3[1] = dVar2 * dVar5;
  }
  unaligned_assign_impl<false>::
  run<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,_1,0,2,2>>,Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,_1,true>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,_1,0,2,2>>>>
            (src,dst,lVar4,end);
  return;
}

Assistant:

static EIGEN_STRONG_INLINE void run(Derived1 &dst, const Derived2 &src)
  {
    const Index size = dst.size();
    typedef packet_traits<typename Derived1::Scalar> PacketTraits;
    enum {
      packetSize = PacketTraits::size,
      dstAlignment = PacketTraits::AlignedOnScalar ? Aligned : int(assign_traits<Derived1,Derived2>::DstIsAligned) ,
      srcAlignment = assign_traits<Derived1,Derived2>::JointAlignment
    };
    const Index alignedStart = assign_traits<Derived1,Derived2>::DstIsAligned ? 0
                             : internal::first_aligned(&dst.coeffRef(0), size);
    const Index alignedEnd = alignedStart + ((size-alignedStart)/packetSize)*packetSize;

    unaligned_assign_impl<assign_traits<Derived1,Derived2>::DstIsAligned!=0>::run(src,dst,0,alignedStart);

    for(Index index = alignedStart; index < alignedEnd; index += packetSize)
    {
      dst.template copyPacket<Derived2, dstAlignment, srcAlignment>(index, src);
    }

    unaligned_assign_impl<>::run(src,dst,alignedEnd,size);
  }